

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimagescale_sse4.cpp
# Opt level: O3

void qt_qimageScaleAARGBA_up_x_down_y_sse4<false>
               (QImageScaleInfo *isi,uint *dest,int dw,int dh,int dow,int sow)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  char cVar12;
  uint uVar13;
  QThreadPool *pQVar14;
  uint *puVar15;
  ulong uVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  uint *puVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long in_FS_OFFSET;
  undefined1 in_XMM0 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  undefined1 in_XMM3 [16];
  undefined1 auVar32 [16];
  int iVar34;
  int iVar35;
  undefined1 in_XMM4 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM6 [16];
  __m128i v256;
  int *yapoints;
  int *xapoints;
  int *xpoints;
  uint **ypoints;
  int **local_d0;
  uint **local_c8;
  int *local_c0;
  uint *local_b8;
  uint ***local_b0;
  int **local_a8;
  int *local_a0;
  int **local_98;
  undefined1 *local_90;
  undefined1 local_88 [16];
  int *local_78;
  int *local_70;
  int *local_68;
  uint **local_60;
  int local_54;
  int local_50;
  uint local_4c;
  uint *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = &local_48;
  local_b8 = &local_4c;
  local_c0 = &local_50;
  local_a0 = &local_54;
  local_60 = isi->ypoints;
  local_b0 = &local_60;
  local_68 = isi->xpoints;
  local_a8 = &local_68;
  local_70 = isi->xapoints;
  local_98 = &local_70;
  local_78 = isi->yapoints;
  local_d0 = &local_78;
  local_88 = pmovsxwd(in_XMM0,0x100010001000100);
  local_90 = local_88;
  lVar19 = (long)isi->sw * (long)isi->sh;
  lVar25 = lVar19 + 0xffff;
  if (-1 < lVar19) {
    lVar25 = lVar19;
  }
  iVar21 = (int)((ulong)lVar25 >> 0x10);
  if (dh <= iVar21) {
    iVar21 = dh;
  }
  local_54 = sow;
  local_50 = dow;
  local_4c = dw;
  local_48 = dest;
  pQVar14 = QGuiApplicationPrivate::qtGuiThreadPool();
  if ((pQVar14 != (QThreadPool *)0x0) && (1 < iVar21)) {
    QThread::currentThread();
    cVar12 = QThreadPool::contains((QThread *)pQVar14);
    if (cVar12 == '\0') {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar24 = 0;
      QSemaphore::QSemaphore((QSemaphore *)&local_40,0);
      do {
        iVar23 = (dh - iVar24) / iVar21;
        puVar17 = (undefined8 *)operator_new(0x18);
        *(undefined1 *)(puVar17 + 1) = 1;
        *puVar17 = QFactoryLoader::keyMap;
        puVar18 = (undefined8 *)operator_new(0x20);
        *puVar18 = QRunnable::QGenericRunnable::
                   Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qimagescale_sse4.cpp:34:31)>
                   ::impl;
        *(int *)(puVar18 + 1) = iVar24;
        *(int *)((long)puVar18 + 0xc) = iVar23;
        puVar18[2] = &local_d0;
        puVar18[3] = &local_40;
        puVar17[2] = puVar18;
        QThreadPool::start((QRunnable *)pQVar14,(int)puVar17);
        iVar24 = iVar24 + iVar23;
        iVar21 = iVar21 + -1;
      } while (iVar21 != 0);
      QSemaphore::acquire((int)(QSemaphore *)&local_40);
      QSemaphore::~QSemaphore((QSemaphore *)&local_40);
      goto LAB_005ae461;
    }
  }
  if (0 < dh) {
    uVar16 = (ulong)local_4c;
    uVar20 = 0;
    do {
      if (0 < (int)uVar16) {
        uVar2 = local_78[uVar20];
        uVar13 = uVar2 & 0xffff;
        iVar21 = (int)uVar2 >> 0x10;
        auVar26._4_4_ = iVar21;
        auVar26._0_4_ = iVar21;
        auVar26._8_4_ = iVar21;
        auVar26._12_4_ = iVar21;
        auVar27._0_8_ = CONCAT44(uVar2,uVar2) & 0xffff0000ffff;
        auVar27._8_4_ = uVar13;
        auVar27._12_4_ = uVar13;
        puVar22 = local_48 + (long)local_50 * uVar20;
        puVar3 = local_60[uVar20];
        lVar25 = 0;
        do {
          puVar1 = puVar3 + local_68[lVar25];
          lVar19 = (long)local_54;
          auVar32 = pmovzxbd(in_XMM3,*puVar1);
          in_XMM3 = pmulld(auVar32,auVar27);
          iVar24 = 0x4000 - uVar13;
          puVar15 = puVar1;
          while( true ) {
            iVar23 = in_XMM3._4_4_;
            iVar33 = in_XMM3._8_4_;
            iVar34 = in_XMM3._12_4_;
            if (iVar24 <= iVar21) break;
            auVar32 = pmovzxbd(in_XMM2,puVar15[lVar19]);
            puVar15 = puVar15 + lVar19;
            in_XMM2 = pmaddwd(auVar32,auVar26);
            in_XMM3._0_4_ = in_XMM3._0_4_ + in_XMM2._0_4_;
            in_XMM3._4_4_ = iVar23 + in_XMM2._4_4_;
            in_XMM3._8_4_ = iVar33 + in_XMM2._8_4_;
            in_XMM3._12_4_ = iVar34 + in_XMM2._12_4_;
            iVar24 = iVar24 - iVar21;
          }
          in_XMM4 = pmovzxbd(in_XMM4,puVar15[lVar19]);
          auVar32._4_4_ = iVar24;
          auVar32._0_4_ = iVar24;
          auVar32._8_4_ = iVar24;
          auVar32._12_4_ = iVar24;
          auVar32 = pmulld(auVar32,in_XMM4);
          auVar28._0_4_ = auVar32._0_4_ + in_XMM3._0_4_;
          auVar28._4_4_ = auVar32._4_4_ + iVar23;
          auVar28._8_4_ = auVar32._8_4_ + iVar33;
          auVar28._12_4_ = auVar32._12_4_ + iVar34;
          iVar24 = local_70[lVar25];
          if (0 < iVar24) {
            puVar15 = puVar1 + 1;
            auVar32 = pmovzxbd(in_XMM3,puVar1[1]);
            in_XMM3 = pmulld(auVar32,auVar27);
            iVar23 = 0x4000 - uVar13;
            while( true ) {
              iVar33 = in_XMM3._4_4_;
              iVar34 = in_XMM3._8_4_;
              iVar35 = in_XMM3._12_4_;
              if (iVar23 <= iVar21) break;
              auVar32 = pmovzxbd(in_XMM4,puVar15[lVar19]);
              puVar15 = puVar15 + lVar19;
              in_XMM4 = pmaddwd(auVar32,auVar26);
              in_XMM3._0_4_ = in_XMM3._0_4_ + in_XMM4._0_4_;
              in_XMM3._4_4_ = iVar33 + in_XMM4._4_4_;
              in_XMM3._8_4_ = iVar34 + in_XMM4._8_4_;
              in_XMM3._12_4_ = iVar35 + in_XMM4._12_4_;
              iVar23 = iVar23 - iVar21;
            }
            in_XMM4._4_4_ = iVar24;
            in_XMM4._0_4_ = iVar24;
            in_XMM4._8_4_ = iVar24;
            in_XMM4._12_4_ = iVar24;
            auVar36._0_4_ = local_88._0_4_ - iVar24;
            auVar36._4_4_ = local_88._4_4_ - iVar24;
            auVar36._8_4_ = local_88._8_4_ - iVar24;
            auVar36._12_4_ = local_88._12_4_ - iVar24;
            in_XMM6 = pmovzxbd(in_XMM6,puVar15[lVar19]);
            auVar36 = pmulld(auVar36,auVar28);
            auVar29._4_4_ = iVar23;
            auVar29._0_4_ = iVar23;
            auVar29._8_4_ = iVar23;
            auVar29._12_4_ = iVar23;
            auVar32 = pmulld(auVar29,in_XMM6);
            auVar30._0_4_ = auVar32._0_4_ + in_XMM3._0_4_;
            auVar30._4_4_ = auVar32._4_4_ + iVar33;
            auVar30._8_4_ = auVar32._8_4_ + iVar34;
            auVar30._12_4_ = auVar32._12_4_ + iVar35;
            auVar32 = pmulld(auVar30,in_XMM4);
            auVar28._0_4_ = (uint)(auVar32._0_4_ + auVar36._0_4_) >> 8;
            auVar28._4_4_ = (uint)(auVar32._4_4_ + auVar36._4_4_) >> 8;
            auVar28._8_4_ = (uint)(auVar32._8_4_ + auVar36._8_4_) >> 8;
            auVar28._12_4_ = (uint)(auVar32._12_4_ + auVar36._12_4_) >> 8;
          }
          auVar31._0_4_ = auVar28._0_4_ >> 0xe;
          auVar31._4_4_ = auVar28._4_4_ >> 0xe;
          auVar31._8_4_ = auVar28._8_4_ >> 0xe;
          auVar31._12_4_ = auVar28._12_4_ >> 0xe;
          auVar32 = packusdw(auVar31,auVar31);
          sVar4 = auVar32._0_2_;
          sVar5 = auVar32._2_2_;
          sVar6 = auVar32._4_2_;
          sVar7 = auVar32._6_2_;
          in_XMM2._0_4_ =
               CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar32[6] - (0xff < sVar7),
                        CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar32[4] - (0xff < sVar6),
                                 CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar32[2] -
                                          (0xff < sVar5),
                                          (0 < sVar4) * (sVar4 < 0x100) * auVar32[0] -
                                          (0xff < sVar4))));
          sVar8 = auVar32._8_2_;
          in_XMM2[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar32[8] - (0xff < sVar8);
          sVar9 = auVar32._10_2_;
          in_XMM2[5] = (0 < sVar9) * (sVar9 < 0x100) * auVar32[10] - (0xff < sVar9);
          sVar10 = auVar32._12_2_;
          in_XMM2[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar32[0xc] - (0xff < sVar10);
          sVar11 = auVar32._14_2_;
          in_XMM2[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar32[0xe] - (0xff < sVar11);
          in_XMM2[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar32[0] - (0xff < sVar4);
          in_XMM2[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar32[2] - (0xff < sVar5);
          in_XMM2[10] = (0 < sVar6) * (sVar6 < 0x100) * auVar32[4] - (0xff < sVar6);
          in_XMM2[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar32[6] - (0xff < sVar7);
          in_XMM2[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar32[8] - (0xff < sVar8);
          in_XMM2[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar32[10] - (0xff < sVar9);
          in_XMM2[0xe] = (0 < sVar10) * (sVar10 < 0x100) * auVar32[0xc] - (0xff < sVar10);
          in_XMM2[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar32[0xe] - (0xff < sVar11);
          *puVar22 = in_XMM2._0_4_;
          puVar22 = puVar22 + 1;
          lVar25 = lVar25 + 1;
          uVar16 = (ulong)(int)local_4c;
        } while (lVar25 < (long)uVar16);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uint)dh);
  }
LAB_005ae461:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qt_qimageScaleAARGBA_up_x_down_y_sse4(QImageScaleInfo *isi, unsigned int *dest,
                                           int dw, int dh, int dow, int sow)
{
    const unsigned int **ypoints = isi->ypoints;
    const int *xpoints = isi->xpoints;
    const int *xapoints = isi->xapoints;
    const int *yapoints = isi->yapoints;

    const __m128i v256 = _mm_set1_epi32(256);

    /* go through every scanline in the output buffer */
    auto scaleSection = [&] (int yStart, int yEnd) {
        for (int y = yStart; y < yEnd; ++y) {
            const int Cy = yapoints[y] >> 16;
            const int yap = yapoints[y] & 0xffff;
            const __m128i vCy = _mm_set1_epi32(Cy);
            const __m128i vyap = _mm_set1_epi32(yap);

            unsigned int *dptr = dest + (y * dow);
            for (int x = 0; x < dw; x++) {
                const unsigned int *sptr = ypoints[y] + xpoints[x];
                __m128i vx = qt_qimageScaleAARGBA_helper(sptr, yap, Cy, sow, vyap, vCy);

                const int xap = xapoints[x];
                if (xap > 0) {
                    const __m128i vxap = _mm_set1_epi32(xap);
                    const __m128i vinvxap = _mm_sub_epi32(v256, vxap);
                    __m128i vr = qt_qimageScaleAARGBA_helper(sptr + 1, yap, Cy, sow, vyap, vCy);

                    vx = _mm_mullo_epi32(vx, vinvxap);
                    vr = _mm_mullo_epi32(vr, vxap);
                    vx = _mm_add_epi32(vx, vr);
                    vx = _mm_srli_epi32(vx, 8);
                }
                vx = _mm_srli_epi32(vx, 14);
                vx = _mm_packus_epi32(vx, vx);
                vx = _mm_packus_epi16(vx, vx);
                *dptr = _mm_cvtsi128_si32(vx);
                if (RGB)
                    *dptr |= 0xff000000;
                dptr++;
            }
        }
    };
    multithread_pixels_function(isi, dh, scaleSection);
}